

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizes
          (CodeGeneratorRequest *this,CodedOutputStream *output)

{
  char *data;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  LogMessage *pLVar2;
  long lVar3;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (0 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      data = *(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar3];
      if ((this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ <= lVar3) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_a1,pLVar2);
        internal::LogMessage::~LogMessage(&local_68);
      }
      internal::WireFormat::VerifyUTF8StringFallback
                (data,*(int *)((long)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_
                                     [lVar3] + 8),SERIALIZE);
      if ((this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ <= lVar3) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar2 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_a1,pLVar2);
        internal::LogMessage::~LogMessage(&local_a0);
      }
      internal::WireFormatLite::WriteString
                (1,(string *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar3],
                 output);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,
               SERIALIZE);
    internal::WireFormatLite::WriteString(2,this->parameter_,output);
  }
  if (0 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      internal::WireFormatLite::WriteMessageMaybeToArray
                (0xf,(MessageLite *)(this->proto_file_).super_RepeatedPtrFieldBase.elements_[lVar3],
                 output);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
  }
  return;
}

Assistant:

void CodeGeneratorRequest::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated string file_to_generate = 1;
  for (int i = 0; i < this->file_to_generate_size(); i++) {
  ::google::protobuf::internal::WireFormat::VerifyUTF8String(
    this->file_to_generate(i).data(), this->file_to_generate(i).length(),
    ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->file_to_generate(i), output);
  }

  // optional string parameter = 2;
  if (has_parameter()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->parameter(), output);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (int i = 0; i < this->proto_file_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, this->proto_file(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}